

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_v7tar.c
# Opt level: O0

int archive_write_v7tar_header(archive_write *a,archive_entry *entry)

{
  long *plVar1;
  mode_t mVar2;
  archive_string_conv *paVar3;
  char *pcVar4;
  size_t sVar5;
  archive_string *paVar6;
  la_int64_t lVar7;
  undefined1 local_270 [8];
  archive_string as;
  size_t path_length;
  char *p;
  archive_string_conv *sconv;
  archive_entry *entry_main;
  v7tar *v7tar;
  int ret2;
  int ret;
  char buff [512];
  archive_entry *entry_local;
  archive_write *a_local;
  
  plVar1 = (long *)a->format_data;
  if (plVar1[2] == 0) {
    if ((int)plVar1[4] == 0) {
      paVar3 = archive_string_default_conversion_for_write((archive_conflict *)a);
      plVar1[3] = (long)paVar3;
      *(undefined4 *)(plVar1 + 4) = 1;
    }
    p = (char *)plVar1[3];
  }
  else {
    p = (char *)plVar1[2];
  }
  pcVar4 = archive_entry_pathname(entry);
  if (pcVar4 == (char *)0x0) {
    archive_set_error(&a->archive,-1,"Can\'t record entry in tar file without pathname");
    a_local._4_4_ = -0x19;
  }
  else {
    pcVar4 = archive_entry_hardlink(entry);
    if (((pcVar4 != (char *)0x0) || (pcVar4 = archive_entry_symlink(entry), pcVar4 != (char *)0x0))
       || (mVar2 = archive_entry_filetype(entry), mVar2 != 0x8000)) {
      archive_entry_set_size(entry,0);
    }
    mVar2 = archive_entry_filetype(entry);
    if (((mVar2 == 0x4000) && (pcVar4 = archive_entry_pathname(entry), pcVar4 != (char *)0x0)) &&
       ((*pcVar4 != '\0' && (sVar5 = strlen(pcVar4), pcVar4[sVar5 - 1] != '/')))) {
      local_270 = (undefined1  [8])0x0;
      as.s = (char *)0x0;
      as.length = 0;
      as.buffer_length = strlen(pcVar4);
      paVar6 = archive_string_ensure((archive_string *)local_270,as.buffer_length + 2);
      if (paVar6 == (archive_string *)0x0) {
        archive_set_error(&a->archive,0xc,"Can\'t allocate v7tar data");
        archive_string_free((archive_string *)local_270);
        return -0x1e;
      }
      as.s = (char *)0x0;
      archive_strncat((archive_string *)local_270,pcVar4,as.buffer_length);
      archive_strappend_char((archive_string *)local_270,'/');
      archive_entry_copy_pathname(entry,(char *)local_270);
      archive_string_free((archive_string *)local_270);
    }
    v7tar._4_4_ = format_header_v7tar(a,(char *)&ret2,entry,1,(archive_string_conv *)p);
    if (v7tar._4_4_ < -0x14) {
      archive_entry_free((archive_entry *)0x0);
      a_local._4_4_ = v7tar._4_4_;
    }
    else {
      a_local._4_4_ = __archive_write_output(a,&ret2,0x200);
      if (a_local._4_4_ < -0x14) {
        archive_entry_free((archive_entry *)0x0);
      }
      else {
        if (a_local._4_4_ < v7tar._4_4_) {
          v7tar._4_4_ = a_local._4_4_;
        }
        lVar7 = archive_entry_size(entry);
        *plVar1 = lVar7;
        plVar1[1] = -*plVar1 & 0x1ff;
        archive_entry_free((archive_entry *)0x0);
        a_local._4_4_ = v7tar._4_4_;
      }
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
archive_write_v7tar_header(struct archive_write *a, struct archive_entry *entry)
{
	char buff[512];
	int ret, ret2;
	struct v7tar *v7tar;
	struct archive_entry *entry_main;
	struct archive_string_conv *sconv;

	v7tar = (struct v7tar *)a->format_data;

	/* Setup default string conversion. */
	if (v7tar->opt_sconv == NULL) {
		if (!v7tar->init_default_conversion) {
			v7tar->sconv_default =
			    archive_string_default_conversion_for_write(
				&(a->archive));
			v7tar->init_default_conversion = 1;
		}
		sconv = v7tar->sconv_default;
	} else
		sconv = v7tar->opt_sconv;

	/* Sanity check. */
	if (archive_entry_pathname(entry) == NULL) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Can't record entry in tar file without pathname");
		return (ARCHIVE_FAILED);
	}

	/* Only regular files (not hardlinks) have data. */
	if (archive_entry_hardlink(entry) != NULL ||
	    archive_entry_symlink(entry) != NULL ||
	    archive_entry_filetype(entry) != AE_IFREG)
		archive_entry_set_size(entry, 0);

	if (AE_IFDIR == archive_entry_filetype(entry)) {
		const char *p;
		size_t path_length;
		/*
		 * Ensure a trailing '/'.  Modify the entry so
		 * the client sees the change.
		 */
#if defined(_WIN32) && !defined(__CYGWIN__)
		const wchar_t *wp;

		wp = archive_entry_pathname_w(entry);
		if (wp != NULL && wp[wcslen(wp) -1] != L'/') {
			struct archive_wstring ws;

			archive_string_init(&ws);
			path_length = wcslen(wp);
			if (archive_wstring_ensure(&ws,
			    path_length + 2) == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate v7tar data");
				archive_wstring_free(&ws);
				return(ARCHIVE_FATAL);
			}
			/* Should we keep '\' ? */
			if (wp[path_length -1] == L'\\')
				path_length--;
			archive_wstrncpy(&ws, wp, path_length);
			archive_wstrappend_wchar(&ws, L'/');
			archive_entry_copy_pathname_w(entry, ws.s);
			archive_wstring_free(&ws);
			p = NULL;
		} else
#endif
			p = archive_entry_pathname(entry);
		/*
		 * On Windows, this is a backup operation just in
		 * case getting WCS failed. On POSIX, this is a
		 * normal operation.
		 */
		if (p != NULL && p[0] != '\0' && p[strlen(p) - 1] != '/') {
			struct archive_string as;

			archive_string_init(&as);
			path_length = strlen(p);
			if (archive_string_ensure(&as,
			    path_length + 2) == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate v7tar data");
				archive_string_free(&as);
				return(ARCHIVE_FATAL);
			}
#if defined(_WIN32) && !defined(__CYGWIN__)
			/* NOTE: This might break the pathname
			 * if the current code page is CP932 and
			 * the pathname includes a character '\'
			 * as a part of its multibyte pathname. */
			if (p[strlen(p) -1] == '\\')
				path_length--;
			else
#endif
			archive_strncpy(&as, p, path_length);
			archive_strappend_char(&as, '/');
			archive_entry_copy_pathname(entry, as.s);
			archive_string_free(&as);
		}
	}

#if defined(_WIN32) && !defined(__CYGWIN__)
	/* Make sure the path separators in pathname, hardlink and symlink
	 * are all slash '/', not the Windows path separator '\'. */
	entry_main = __la_win_entry_in_posix_pathseparator(entry);
	if (entry_main == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate v7tar data");
		return(ARCHIVE_FATAL);
	}
	if (entry != entry_main)
		entry = entry_main;
	else
		entry_main = NULL;
#else
	entry_main = NULL;
#endif
	ret = format_header_v7tar(a, buff, entry, 1, sconv);
	if (ret < ARCHIVE_WARN) {
		archive_entry_free(entry_main);
		return (ret);
	}
	ret2 = __archive_write_output(a, buff, 512);
	if (ret2 < ARCHIVE_WARN) {
		archive_entry_free(entry_main);
		return (ret2);
	}
	if (ret2 < ret)
		ret = ret2;

	v7tar->entry_bytes_remaining = archive_entry_size(entry);
	v7tar->entry_padding = 0x1ff & (-(int64_t)v7tar->entry_bytes_remaining);
	archive_entry_free(entry_main);
	return (ret);
}